

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMTypeRef CompileLlvmType(LlvmCompilationContext *ctx,TypeBase *type)

{
  SmallArray<LLVMTypeRefOpaque_*,_128U> *this;
  long lVar1;
  LLVMTypeRefOpaque **ppLVar2;
  ExpressionContext *pEVar3;
  uint *puVar4;
  TypeBase *type_00;
  SmallArray<LLVMTypeRefOpaque_*,_32U> members;
  LLVMTypeRef local_150;
  SmallArray<LLVMTypeRefOpaque_*,_32U> local_148;
  
  this = &ctx->types;
  ppLVar2 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[](this,type->typeIndex);
  if (*ppLVar2 != (LLVMTypeRefOpaque *)0x0) {
    return *ppLVar2;
  }
  switch(type->typeID) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0x19:
    goto switchD_00175256_caseD_1;
  case 0xb:
  case 0x10:
  case 0x11:
    pEVar3 = ctx->ctx;
LAB_0017525b:
    type_00 = pEVar3->typeChar;
    break;
  default:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x1ba,"LLVMTypeRef CompileLlvmType(LlvmCompilationContext &, TypeBase *)");
  case 0x12:
    type_00 = (TypeBase *)type[1]._vptr_TypeBase;
    pEVar3 = ctx->ctx;
    if (type_00 == pEVar3->typeVoid) goto LAB_0017525b;
    break;
  case 0x13:
    type_00 = (TypeBase *)type[1]._vptr_TypeBase;
    break;
  case 0x14:
    type_00 = *(TypeBase **)&type[1].typeIndex;
    break;
  case 0x15:
    CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    type_00 = ctx->ctx->typeNullPtr;
    break;
  case 0x18:
    CreateLlvmName(ctx,type->name);
    ppLVar2 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[](this,type->typeIndex);
    *ppLVar2 = (LLVMTypeRefOpaque *)&placeholderType;
    local_148.allocator = ctx->allocator;
    local_148.data = local_148.little;
    local_148.count = 0;
    local_148.max = 0x20;
    puVar4 = &type[1].typeID;
    while (lVar1 = *(long *)puVar4, lVar1 != 0) {
      local_150 = CompileLlvmType(ctx,*(TypeBase **)(*(long *)(lVar1 + 8) + 0x20));
      SmallArray<LLVMTypeRefOpaque_*,_32U>::push_back(&local_148,&local_150);
      puVar4 = (uint *)(lVar1 + 0x18);
    }
    SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[](this,type->typeIndex);
    SmallArray<LLVMTypeRefOpaque_*,_32U>::~SmallArray(&local_148);
    goto LAB_001752bf;
  }
  CompileLlvmType(ctx,type_00);
switchD_00175256_caseD_1:
  ppLVar2 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[](this,type->typeIndex);
  *ppLVar2 = (LLVMTypeRefOpaque *)&placeholderType;
LAB_001752bf:
  ppLVar2 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[](this,type->typeIndex);
  return *ppLVar2;
}

Assistant:

LLVMTypeRef CompileLlvmType(LlvmCompilationContext &ctx, TypeBase *type)
{
	if(LLVMTypeRef llvmType = ctx.types[type->typeIndex])
		return llvmType;

	if(isType<TypeVoid>(type))
	{
		ctx.types[type->typeIndex] = LLVMVoidTypeInContext(ctx.context);
	}
	else if(isType<TypeBool>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt1TypeInContext(ctx.context);
	}
	else if(isType<TypeChar>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt8TypeInContext(ctx.context);
	}
	else if(isType<TypeShort>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt16TypeInContext(ctx.context);
	}
	else if(isType<TypeInt>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt32TypeInContext(ctx.context);
	}
	else if(isType<TypeLong>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt64TypeInContext(ctx.context);
	}
	else if(isType<TypeFloat>(type))
	{
		ctx.types[type->typeIndex] = LLVMFloatTypeInContext(ctx.context);
	}
	else if(isType<TypeDouble>(type))
	{
		ctx.types[type->typeIndex] = LLVMDoubleTypeInContext(ctx.context);
	}
	else if(isType<TypeTypeID>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt32TypeInContext(ctx.context);
	}
	else if(isType<TypeFunctionID>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt32TypeInContext(ctx.context);
	}
	else if(isType<TypeNullptr>(type))
	{
		ctx.types[type->typeIndex] = LLVMPointerType(CompileLlvmType(ctx, ctx.ctx.typeChar), 0);
	}
	else if(isType<TypeAutoRef>(type))
	{
		LLVMTypeRef members[2] = { LLVMInt32TypeInContext(ctx.context), LLVMPointerType(CompileLlvmType(ctx, ctx.ctx.typeChar), 0) };

		ctx.types[type->typeIndex] = LLVMStructTypeInContext(ctx.context, members, 2, true);
	}
	else if(isType<TypeAutoArray>(type))
	{
		LLVMTypeRef members[3] = { LLVMInt32TypeInContext(ctx.context), LLVMPointerType(CompileLlvmType(ctx, ctx.ctx.typeChar), 0), LLVMInt32TypeInContext(ctx.context) };

		ctx.types[type->typeIndex] = LLVMStructTypeInContext(ctx.context, members, 3, true);
	}
	else if(TypeRef *typeRef = getType<TypeRef>(type))
	{
		ctx.types[type->typeIndex] = LLVMPointerType(CompileLlvmType(ctx, typeRef->subType == ctx.ctx.typeVoid ? ctx.ctx.typeChar : typeRef->subType), 0);
	}
	else if(TypeArray *typeArray = getType<TypeArray>(type))
	{
		if(typeArray->subType == ctx.ctx.typeChar)
			ctx.types[type->typeIndex] = LLVMArrayType(CompileLlvmType(ctx, typeArray->subType), ((unsigned)typeArray->length + 3u) & ~3u);
		else
			ctx.types[type->typeIndex] = LLVMArrayType(CompileLlvmType(ctx, typeArray->subType), (unsigned)typeArray->length);
	}
	else if(TypeUnsizedArray *typeUnsizedArray = getType<TypeUnsizedArray>(type))
	{
		LLVMTypeRef members[2] = { LLVMPointerType(CompileLlvmType(ctx, typeUnsizedArray->subType), 0), LLVMInt32TypeInContext(ctx.context) };

		ctx.types[type->typeIndex] = LLVMStructTypeInContext(ctx.context, members, 2, true);
	}
	else if(isType<TypeFunction>(type))
	{
		// TODO: use function indices and remap before execution
		//LLVMTypeRef members[2] = { LLVMPointerType(CompileLlvmType(ctx, ctx.ctx.typeChar), 0), LLVMInt32TypeInContext(ctx.context) };
		LLVMTypeRef members[2] = { CompileLlvmType(ctx, ctx.ctx.typeNullPtr), CompileLlvmType(ctx, ctx.ctx.typeNullPtr) };

		ctx.types[type->typeIndex] = LLVMStructTypeInContext(ctx.context, members, 2, true);
	}
	else if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		ctx.types[type->typeIndex] = LLVMStructCreateNamed(ctx.context, CreateLlvmName(ctx, typeClass->name));

		SmallArray<LLVMTypeRef, 32> members(ctx.allocator);

		for(MemberHandle *curr = typeClass->members.head; curr; curr = curr->next)
			members.push_back(CompileLlvmType(ctx, curr->variable->type));

		// TODO: create packed type with custom padding
		LLVMStructSetBody(ctx.types[type->typeIndex], members.data, members.count, false);
	}
	else if(isType<TypeEnum>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt32TypeInContext(ctx.context);
	}
	else
	{
		assert(!"unknown type");
	}

	return ctx.types[type->typeIndex];
}